

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# augmentedmatrix.cpp
# Opt level: O1

bool __thiscall
AugmentedMatrix::setMatrixData(AugmentedMatrix *this,fraction *valves,int width,int height)

{
  fraction *pfVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  
  this->width = width;
  this->height = height;
  if (0 < height) {
    uVar3 = 0xffffffffffffffff;
    if (-1 < width) {
      uVar3 = (long)width << 4;
    }
    uVar4 = 0;
    do {
      pfVar1 = (fraction *)operator_new__(uVar3);
      if (0 < width) {
        lVar2 = 0;
        do {
          *(unkbyte10 *)((long)pfVar1 + lVar2) = *(unkbyte10 *)((long)valves + lVar2);
          lVar2 = lVar2 + 0x10;
        } while ((ulong)(uint)width * 0x10 != lVar2);
      }
      this->matrix[uVar4] = pfVar1;
      uVar4 = uVar4 + 1;
      valves = valves + (uint)width;
    } while (uVar4 != (uint)height);
  }
  return true;
}

Assistant:

bool AugmentedMatrix::setMatrixData(fraction *valves , int width, int height)
{
    this->width = width;
    this->height = height;

    for(int i=0 ; i<this->height ; i++)
    {
        fraction *x = new fraction[this->width];
        for(int j=0 ; j<this->width ; j++)
            x[j] = valves[i*this->width + j];
        matrix[i] = x;
    }

    return true;
}